

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall
mkvparser::Segment::DoParseNext(Segment *this,Cluster **pResult,longlong *pos,long *len)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  Cues *this_00;
  longlong lVar4;
  Cluster *pCluster;
  long lVar5;
  Cues *local_168;
  long local_160;
  longlong unknown_size_1;
  longlong size_1;
  longlong id_1;
  longlong idpos_1;
  longlong result_1;
  longlong payload_pos;
  ptrdiff_t idx_next;
  Cluster *pNext_1;
  long len_;
  longlong pos_;
  Cluster *pNext;
  Cluster **k;
  Cluster **j;
  Cluster **jj;
  Cluster **i;
  Cluster **ii;
  undefined1 local_b1;
  Cues *local_b0;
  longlong local_a8;
  longlong element_size;
  longlong element_start;
  longlong element_stop;
  longlong unknown_size;
  longlong size;
  longlong id;
  longlong idoff;
  longlong idpos;
  longlong result;
  longlong cluster_size;
  longlong off_next;
  longlong segment_stop;
  long status;
  longlong avail;
  longlong total;
  long *len_local;
  longlong *pos_local;
  Cluster **pResult_local;
  Segment *this_local;
  
  total = (longlong)len;
  len_local = pos;
  pos_local = (longlong *)pResult;
  pResult_local = (Cluster **)this;
  iVar3 = (*this->m_pReader->_vptr_IMkvReader[1])(this->m_pReader,&avail,&status);
  segment_stop = (longlong)iVar3;
  if (segment_stop < 0) {
    return segment_stop;
  }
  if (-1 < avail && avail < status) {
    __assert_fail("(total < 0) || (avail <= total)",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0xb21,
                  "long mkvparser::Segment::DoParseNext(const Cluster *&, long long &, long &)");
  }
  if (this->m_size < 0) {
    local_160 = -1;
  }
  else {
    local_160 = this->m_start + this->m_size;
  }
  off_next = local_160;
  cluster_size = 0;
  result = -1;
  while( true ) {
    while( true ) {
      do {
        if ((-1 < avail) && (avail <= *len_local)) {
          return 1;
        }
        if ((-1 < off_next) && (off_next <= *len_local)) {
          return 1;
        }
        if (status < *len_local + 1) {
          *(undefined8 *)total = 1;
          return -3;
        }
        idpos = GetUIntLength(this->m_pReader,*len_local,(long *)total);
        if (idpos < 0) {
          return idpos;
        }
        if (0 < idpos) {
          return -3;
        }
        if ((-1 < off_next) && (off_next < *len_local + *(long *)total)) {
          return -2;
        }
        if (status < *len_local + *(long *)total) {
          return -3;
        }
        idoff = *len_local;
        id = *len_local - this->m_start;
        size = ReadID(this->m_pReader,idoff,(long *)total);
        if (size < 0) {
          return size;
        }
        if (size == 0) {
          return -1;
        }
        *len_local = *(long *)total + *len_local;
        if (status < *len_local + 1) {
          *(undefined8 *)total = 1;
          return -3;
        }
        idpos = GetUIntLength(this->m_pReader,*len_local,(long *)total);
        if (idpos < 0) {
          return idpos;
        }
        if (0 < idpos) {
          return -3;
        }
        if ((-1 < off_next) && (off_next < *len_local + *(long *)total)) {
          return -2;
        }
        if (status < *len_local + *(long *)total) {
          return -3;
        }
        unknown_size = ReadUInt(this->m_pReader,*len_local,(long *)total);
        if (unknown_size < 0) {
          return unknown_size;
        }
        *len_local = *(long *)total + *len_local;
      } while (unknown_size == 0);
      element_stop = (1L << ((char)*(undefined8 *)total * '\a' & 0x3fU)) + -1;
      if (((-1 < off_next) && (unknown_size != element_stop)) &&
         (off_next < unknown_size + *len_local)) {
        return -2;
      }
      if (size != 0x1c53bb6b) break;
      if (unknown_size == element_stop) {
        return -2;
      }
      element_start = unknown_size + *len_local;
      if ((-1 < off_next) && (off_next < element_start)) {
        return -2;
      }
      element_size = idoff;
      local_a8 = element_start - idoff;
      if (this->m_pCues == (Cues *)0x0) {
        this_00 = (Cues *)operator_new(0x48,(nothrow_t *)&std::nothrow);
        local_b1 = 0;
        local_168 = (Cues *)0x0;
        if (this_00 != (Cues *)0x0) {
          local_b1 = 1;
          local_b0 = this_00;
          Cues::Cues(this_00,this,*len_local,unknown_size,element_size,local_a8);
          local_168 = this_00;
        }
        this->m_pCues = local_168;
        if (this->m_pCues == (Cues *)0x0) {
          return 0;
        }
      }
      *len_local = unknown_size + *len_local;
      if ((-1 < off_next) && (off_next < *len_local)) {
        return -2;
      }
    }
    if (size == 0x1f43b675) break;
    if (unknown_size == element_stop) {
      return -2;
    }
    *len_local = unknown_size + *len_local;
    if ((-1 < off_next) && (off_next < *len_local)) {
      return -2;
    }
  }
  cluster_size = id;
  if (unknown_size != element_stop) {
    result = unknown_size;
  }
  if (id < 1) {
    __assert_fail("off_next > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0xba9,
                  "long mkvparser::Segment::DoParseNext(const Cluster *&, long long &, long &)");
  }
  jj = this->m_clusters + this->m_clusterCount;
  k = jj + this->m_clusterPreloadCount;
  j = k;
  i = jj;
  while (jj < k) {
    auVar1._8_8_ = (long)k - (long)jj >> 0x3f;
    auVar1._0_8_ = (long)k - (long)jj >> 3;
    pNext = (Cluster *)(jj + SUB168(auVar1 / SEXT816(2),0));
    if (j <= pNext) {
      __assert_fail("k < jj",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0xbbe,
                    "long mkvparser::Segment::DoParseNext(const Cluster *&, long long &, long &)");
    }
    pos_ = (longlong)pNext->m_pSegment;
    if ((Segment *)pos_ == (Segment *)0x0) {
      __assert_fail("pNext",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0xbc1,
                    "long mkvparser::Segment::DoParseNext(const Cluster *&, long long &, long &)");
    }
    if (-1 < ((Segment *)pos_)->m_start) {
      __assert_fail("pNext->m_index < 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0xbc2,
                    "long mkvparser::Segment::DoParseNext(const Cluster *&, long long &, long &)");
    }
    lVar4 = Cluster::GetPosition((Cluster *)pos_);
    *len_local = lVar4;
    if (*len_local < 0) {
      __assert_fail("pos >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0xbc5,
                    "long mkvparser::Segment::DoParseNext(const Cluster *&, long long &, long &)");
    }
    if (*len_local < cluster_size) {
      jj = (Cluster **)&pNext->m_element_start;
    }
    else {
      if (*len_local <= cluster_size) {
        *pos_local = pos_;
        return 0;
      }
      k = (Cluster **)pNext;
    }
  }
  if (jj != k) {
    __assert_fail("i == j",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0xbd1,
                  "long mkvparser::Segment::DoParseNext(const Cluster *&, long long &, long &)");
  }
  segment_stop = Cluster::HasBlockEntries(this,cluster_size,&len_,(long *)&pNext_1);
  if (segment_stop < 0) {
    *len_local = len_;
    *(Cluster **)total = pNext_1;
    this_local = (Segment *)segment_stop;
  }
  else if (segment_stop < 1) {
    if (result < 0) {
      lVar5 = *len_local;
      do {
        do {
          if (((-1 < avail) && (avail <= *len_local)) ||
             ((-1 < off_next && (off_next <= *len_local)))) {
LAB_00127279:
            result = *len_local - lVar5;
            if (result < 0) {
              __assert_fail("cluster_size >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                            ,0xc53,
                            "long mkvparser::Segment::DoParseNext(const Cluster *&, long long &, long &)"
                           );
            }
            *len_local = lVar5;
            goto LAB_001272c1;
          }
          if (status < *len_local + 1) {
            *(undefined8 *)total = 1;
            return -3;
          }
          lVar4 = GetUIntLength(this->m_pReader,*len_local,(long *)total);
          if (lVar4 < 0) {
            return lVar4;
          }
          if (0 < lVar4) {
            return -3;
          }
          if ((-1 < off_next) && (off_next < *len_local + *(long *)total)) {
            return -2;
          }
          if (status < *len_local + *(long *)total) {
            return -3;
          }
          lVar4 = ReadID(this->m_pReader,*len_local,(long *)total);
          if (lVar4 < 0) {
            return lVar4;
          }
          if ((lVar4 == 0x1f43b675) || (lVar4 == 0x1c53bb6b)) goto LAB_00127279;
          *len_local = *(long *)total + *len_local;
          if (status < *len_local + 1) {
            *(undefined8 *)total = 1;
            return -3;
          }
          lVar4 = GetUIntLength(this->m_pReader,*len_local,(long *)total);
          if (lVar4 < 0) {
            return lVar4;
          }
          if (0 < lVar4) {
            return -3;
          }
          if ((-1 < off_next) && (off_next < *len_local + *(long *)total)) {
            return -2;
          }
          if (status < *len_local + *(long *)total) {
            return -3;
          }
          lVar4 = ReadUInt(this->m_pReader,*len_local,(long *)total);
          if (lVar4 < 0) {
            return lVar4;
          }
          *len_local = *(long *)total + *len_local;
        } while (lVar4 == 0);
        if (lVar4 == (1L << ((char)*(undefined8 *)total * '\a' & 0x3fU)) + -1) {
          return -2;
        }
        if ((-1 < off_next) && (off_next < lVar4 + *len_local)) {
          return -2;
        }
        *len_local = lVar4 + *len_local;
      } while ((off_next < 0) || (*len_local <= off_next));
      this_local = (Segment *)0xfffffffffffffffe;
    }
    else {
LAB_001272c1:
      *len_local = result + *len_local;
      if ((off_next < 0) || (*len_local <= off_next)) {
        this_local = (Segment *)0x2;
      }
      else {
        this_local = (Segment *)0xfffffffffffffffe;
      }
    }
  }
  else {
    pCluster = Cluster::Create(this,-1,cluster_size);
    if (pCluster == (Cluster *)0x0) {
      this_local = (Segment *)0xffffffffffffffff;
    }
    else {
      lVar5 = (long)jj - (long)this->m_clusters >> 3;
      bVar2 = PreloadCluster(this,pCluster,lVar5);
      if (bVar2) {
        if (this->m_clusters == (Cluster **)0x0) {
          __assert_fail("m_clusters",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0xbec,
                        "long mkvparser::Segment::DoParseNext(const Cluster *&, long long &, long &)"
                       );
        }
        if (this->m_clusterSize <= lVar5) {
          __assert_fail("idx_next < m_clusterSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0xbed,
                        "long mkvparser::Segment::DoParseNext(const Cluster *&, long long &, long &)"
                       );
        }
        if (this->m_clusters[lVar5] != pCluster) {
          __assert_fail("m_clusters[idx_next] == pNext",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0xbee,
                        "long mkvparser::Segment::DoParseNext(const Cluster *&, long long &, long &)"
                       );
        }
        *pos_local = (longlong)pCluster;
        this_local = (Segment *)0x0;
      }
      else {
        if (pCluster != (Cluster *)0x0) {
          Cluster::~Cluster(pCluster);
          operator_delete(pCluster);
        }
        this_local = (Segment *)0xffffffffffffffff;
      }
    }
  }
  return (long)this_local;
}

Assistant:

long Segment::DoParseNext(const Cluster*& pResult, long long& pos, long& len) {
  long long total, avail;

  long status = m_pReader->Length(&total, &avail);

  if (status < 0)  // error
    return status;

  assert((total < 0) || (avail <= total));

  const long long segment_stop = (m_size < 0) ? -1 : m_start + m_size;

  // Parse next cluster.  This is strictly a parsing activity.
  // Creation of a new cluster object happens later, after the
  // parsing is done.

  long long off_next = 0;
  long long cluster_size = -1;

  for (;;) {
    if ((total >= 0) && (pos >= total))
      return 1;  // EOF

    if ((segment_stop >= 0) && (pos >= segment_stop))
      return 1;  // EOF

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    long long result = GetUIntLength(m_pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // weird
      return E_BUFFER_NOT_FULL;

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long idpos = pos;  // absolute
    const long long idoff = pos - m_start;  // relative

    const long long id = ReadID(m_pReader, idpos, len);  // absolute

    if (id < 0)  // error
      return static_cast<long>(id);

    if (id == 0)  // weird
      return -1;  // generic error

    pos += len;  // consume ID

    // Read Size

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    result = GetUIntLength(m_pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // weird
      return E_BUFFER_NOT_FULL;

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long size = ReadUInt(m_pReader, pos, len);

    if (size < 0)  // error
      return static_cast<long>(size);

    pos += len;  // consume length of size of element

    // Pos now points to start of payload

    if (size == 0)  // weird
      continue;

    const long long unknown_size = (1LL << (7 * len)) - 1;

    if ((segment_stop >= 0) && (size != unknown_size) &&
        ((pos + size) > segment_stop)) {
      return E_FILE_FORMAT_INVALID;
    }

    if (id == libwebm::kMkvCues) {
      if (size == unknown_size)
        return E_FILE_FORMAT_INVALID;

      const long long element_stop = pos + size;

      if ((segment_stop >= 0) && (element_stop > segment_stop))
        return E_FILE_FORMAT_INVALID;

      const long long element_start = idpos;
      const long long element_size = element_stop - element_start;

      if (m_pCues == NULL) {
        m_pCues = new (std::nothrow)
            Cues(this, pos, size, element_start, element_size);
        if (m_pCues == NULL)
          return false;
      }

      pos += size;  // consume payload
      if (segment_stop >= 0 && pos > segment_stop)
        return E_FILE_FORMAT_INVALID;

      continue;
    }

    if (id != libwebm::kMkvCluster) {  // not a Cluster ID
      if (size == unknown_size)
        return E_FILE_FORMAT_INVALID;

      pos += size;  // consume payload
      if (segment_stop >= 0 && pos > segment_stop)
        return E_FILE_FORMAT_INVALID;

      continue;
    }

    // We have a cluster.
    off_next = idoff;

    if (size != unknown_size)
      cluster_size = size;

    break;
  }

  assert(off_next > 0);  // have cluster

  // We have parsed the next cluster.
  // We have not created a cluster object yet.  What we need
  // to do now is determine whether it has already be preloaded
  //(in which case, an object for this cluster has already been
  // created), and if not, create a new cluster object.

  Cluster** const ii = m_clusters + m_clusterCount;
  Cluster** i = ii;

  Cluster** const jj = ii + m_clusterPreloadCount;
  Cluster** j = jj;

  while (i < j) {
    // INVARIANT:
    //[0, i) < pos_next
    //[i, j) ?
    //[j, jj)  > pos_next

    Cluster** const k = i + (j - i) / 2;
    assert(k < jj);

    const Cluster* const pNext = *k;
    assert(pNext);
    assert(pNext->m_index < 0);

    pos = pNext->GetPosition();
    assert(pos >= 0);

    if (pos < off_next)
      i = k + 1;
    else if (pos > off_next)
      j = k;
    else {
      pResult = pNext;
      return 0;  // success
    }
  }

  assert(i == j);

  long long pos_;
  long len_;

  status = Cluster::HasBlockEntries(this, off_next, pos_, len_);

  if (status < 0) {  // error or underflow
    pos = pos_;
    len = len_;

    return status;
  }

  if (status > 0) {  // means "found at least one block entry"
    Cluster* const pNext = Cluster::Create(this,
                                           -1,  // preloaded
                                           off_next);
    if (pNext == NULL)
      return -1;

    const ptrdiff_t idx_next = i - m_clusters;  // insertion position

    if (!PreloadCluster(pNext, idx_next)) {
      delete pNext;
      return -1;
    }
    assert(m_clusters);
    assert(idx_next < m_clusterSize);
    assert(m_clusters[idx_next] == pNext);

    pResult = pNext;
    return 0;  // success
  }

  // status == 0 means "no block entries found"

  if (cluster_size < 0) {  // unknown size
    const long long payload_pos = pos;  // absolute pos of cluster payload

    for (;;) {  // determine cluster size
      if ((total >= 0) && (pos >= total))
        break;

      if ((segment_stop >= 0) && (pos >= segment_stop))
        break;  // no more clusters

      // Read ID

      if ((pos + 1) > avail) {
        len = 1;
        return E_BUFFER_NOT_FULL;
      }

      long long result = GetUIntLength(m_pReader, pos, len);

      if (result < 0)  // error
        return static_cast<long>(result);

      if (result > 0)  // weird
        return E_BUFFER_NOT_FULL;

      if ((segment_stop >= 0) && ((pos + len) > segment_stop))
        return E_FILE_FORMAT_INVALID;

      if ((pos + len) > avail)
        return E_BUFFER_NOT_FULL;

      const long long idpos = pos;
      const long long id = ReadID(m_pReader, idpos, len);

      if (id < 0)  // error (or underflow)
        return static_cast<long>(id);

      // This is the distinguished set of ID's we use to determine
      // that we have exhausted the sub-element's inside the cluster
      // whose ID we parsed earlier.

      if (id == libwebm::kMkvCluster || id == libwebm::kMkvCues)
        break;

      pos += len;  // consume ID (of sub-element)

      // Read Size

      if ((pos + 1) > avail) {
        len = 1;
        return E_BUFFER_NOT_FULL;
      }

      result = GetUIntLength(m_pReader, pos, len);

      if (result < 0)  // error
        return static_cast<long>(result);

      if (result > 0)  // weird
        return E_BUFFER_NOT_FULL;

      if ((segment_stop >= 0) && ((pos + len) > segment_stop))
        return E_FILE_FORMAT_INVALID;

      if ((pos + len) > avail)
        return E_BUFFER_NOT_FULL;

      const long long size = ReadUInt(m_pReader, pos, len);

      if (size < 0)  // error
        return static_cast<long>(size);

      pos += len;  // consume size field of element

      // pos now points to start of sub-element's payload

      if (size == 0)  // weird
        continue;

      const long long unknown_size = (1LL << (7 * len)) - 1;

      if (size == unknown_size)
        return E_FILE_FORMAT_INVALID;  // not allowed for sub-elements

      if ((segment_stop >= 0) && ((pos + size) > segment_stop))  // weird
        return E_FILE_FORMAT_INVALID;

      pos += size;  // consume payload of sub-element
      if (segment_stop >= 0 && pos > segment_stop)
        return E_FILE_FORMAT_INVALID;
    }  // determine cluster size

    cluster_size = pos - payload_pos;
    assert(cluster_size >= 0);  // TODO: handle cluster_size = 0

    pos = payload_pos;  // reset and re-parse original cluster
  }

  pos += cluster_size;  // consume payload
  if (segment_stop >= 0 && pos > segment_stop)
    return E_FILE_FORMAT_INVALID;

  return 2;  // try to find a cluster that follows next
}